

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-pta-dump.cpp
# Opt level: O2

void dumpPointerGraphData(PSNode *n,PTType type,bool dot)

{
  MemoryObject *mo_00;
  long lVar1;
  const_iterator __begin1;
  long *plVar2;
  _Base_ptr p_Var3;
  const_iterator __end1;
  char *pcVar4;
  MemoryObject *mo;
  
  mo_00 = *(MemoryObject **)(n + 0x10);
  if (type == fi) {
    if (mo_00 != (MemoryObject *)0x0) {
      if (dot) {
        printf("\\n    Memory: ---\\n");
      }
      else {
        puts("    Memory: ---");
      }
      dumpMemoryObject(mo_00,6,dot);
      if (!dot) {
        pcVar4 = "    -----------";
        goto LAB_0011daf2;
      }
    }
  }
  else if (mo_00 != (MemoryObject *)0x0) {
    pcVar4 = "    Memory map: [%p]\n";
    if (dot) {
      pcVar4 = "\\n------\\n    --- Memory map [%p] ---\\n";
    }
    printf(pcVar4,mo_00);
    if (verbose_more[0x80] == '\0') {
      plVar2 = *(long **)(n + 0x40);
      if (*(long **)(n + 0x48) != plVar2) {
        do {
          if (plVar2 == *(long **)(n + 0x48)) goto LAB_0011da98;
          lVar1 = *plVar2;
          plVar2 = plVar2 + 1;
        } while (*(long *)(lVar1 + 0x10) == *(long *)(n + 0x10));
      }
    }
    for (p_Var3 = (mo_00->pointsTo)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var3 != (_Base_ptr)&mo_00->pointsTo; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3))
    {
      if (dot) {
        putchar(0x3c);
        printName(*(PSNode **)(p_Var3 + 1),true);
        putchar(0x3e);
        printf("\\l");
      }
      else {
        printf("%*s",6,"");
        putchar(0x3c);
        printName(*(PSNode **)(p_Var3 + 1),false);
        putchar(0x3e);
        putchar(10);
      }
      dumpMemoryObject((MemoryObject *)p_Var3[1]._M_parent,10,dot);
    }
LAB_0011da98:
    if (!dot) {
      pcVar4 = "    ----------------";
LAB_0011daf2:
      puts(pcVar4);
      return;
    }
  }
  return;
}

Assistant:

static void dumpPointerGraphData(PSNode *n, PTType type, bool dot = false) {
    assert(n && "No node given");
    if (type == dg::LLVMPointerAnalysisOptions::AnalysisType::fi) {
        MemoryObject *mo = n->getData<MemoryObject>();
        if (!mo)
            return;

        if (dot)
            printf("\\n    Memory: ---\\n");
        else
            printf("    Memory: ---\n");

        dumpMemoryObject(mo, 6, dot);

        if (!dot)
            printf("    -----------\n");
    } else {
        PointerAnalysisFS::MemoryMapT *mm =
                n->getData<PointerAnalysisFS::MemoryMapT>();
        if (!mm)
            return;

        if (dot)
            printf(R"(\n------\n    --- Memory map [%p] ---\n)",
                   static_cast<void *>(mm));
        else
            printf("    Memory map: [%p]\n", static_cast<void *>(mm));

        if (verbose_more || mmChanged(n))
            dumpMemoryMap(mm, 6, dot);

        if (!dot)
            printf("    ----------------\n");
    }
}